

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

bool __thiscall
QHttpHeaders::replaceOrAppend(QHttpHeaders *this,QAnyStringView name,QAnyStringView newValue)

{
  QHttpHeadersPrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  DataPointer in_stack_ffffffffffffff88;
  _Variant_storage<false,_QHttpHeaders::WellKnownHeader,_QByteArray> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 == (QHttpHeadersPrivate *)0x0) || ((pQVar1->headers).d.size == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      bVar2 = append(this,name,newValue);
      return bVar2;
    }
    goto LAB_00185ab9;
  }
  bVar2 = isValidHttpHeaderNameField(name);
  if (bVar2) {
    bVar2 = isValidHttpHeaderValueField(newValue);
    if (!bVar2) goto LAB_00185a98;
    HeaderName::HeaderName((HeaderName *)&local_58,name);
    normalizedValue((QByteArray *)&stack0xffffffffffffff90,newValue);
    QHttpHeadersPrivate::replaceOrAppend
              (&this->d,(HeaderName *)&local_58,(QByteArray)in_stack_ffffffffffffff88);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&stack0xffffffffffffff90)
    ;
    std::__detail::__variant::_Variant_storage<false,_QHttpHeaders::WellKnownHeader,_QByteArray>::
    _M_reset(&local_58);
    bVar2 = true;
  }
  else {
LAB_00185a98:
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
LAB_00185ab9:
  __stack_chk_fail();
}

Assistant:

bool QHttpHeaders::replaceOrAppend(QAnyStringView name, QAnyStringView newValue)
{
    if (isEmpty())
        return append(name, newValue);

    if (!isValidHttpHeaderNameField(name) || !isValidHttpHeaderValueField(newValue))
        return false;

    QHttpHeadersPrivate::replaceOrAppend(d, HeaderName{name}, normalizedValue(newValue));
    return true;
}